

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addMeanSquareError<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *mseInputName,
               char *targetName)

{
  NetworkUpdateParameters *this;
  LossLayer *this_00;
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_01;
  string *value;
  FeatureDescription *trainingInput;
  FeatureDescription output;
  MeanSquaredErrorLossLayer *mseLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  char *targetName_local;
  char *mseInputName_local;
  char *lossName_local;
  NeuralNetworkClassifier *nn_local;
  Model *m_local;
  
  this = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::add_losslayers(this);
  CoreML::Specification::LossLayer::set_name(this_00,lossName);
  output._40_8_ = CoreML::Specification::LossLayer::mutable_meansquarederrorlosslayer(this_00);
  CoreML::Specification::MeanSquaredErrorLossLayer::set_input
            ((MeanSquaredErrorLossLayer *)output._40_8_,mseInputName);
  CoreML::Specification::MeanSquaredErrorLossLayer::set_target
            ((MeanSquaredErrorLossLayer *)output._40_8_,targetName);
  pMVar1 = CoreML::Specification::Model::description(m);
  pFVar2 = CoreML::Specification::ModelDescription::output(pMVar1,0);
  CoreML::Specification::FeatureDescription::FeatureDescription
            ((FeatureDescription *)&trainingInput,pFVar2);
  pMVar1 = CoreML::Specification::Model::mutable_description(m);
  this_01 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar1);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (this_01);
  CoreML::Specification::FeatureDescription::CopyFrom(pFVar2,(FeatureDescription *)&trainingInput);
  value = CoreML::Specification::MeanSquaredErrorLossLayer::target_abi_cxx11_
                    ((MeanSquaredErrorLossLayer *)output._40_8_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,value);
  CoreML::Specification::FeatureDescription::~FeatureDescription
            ((FeatureDescription *)&trainingInput);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}